

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

char * Wlc_ReduceMarkedInitStr(Wlc_Ntk_t *p,char *pInit)

{
  ulong uVar1;
  Wlc_Obj_t *pWVar2;
  int *piVar3;
  uint uVar4;
  size_t sVar5;
  char *__dest;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  
  iVar13 = 0;
  if (pInit == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(pInit);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,pInit);
  }
  lVar6 = (long)(p->vCis).nSize;
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  else {
    piVar3 = (p->vCis).pArray;
    lVar7 = 0;
    iVar9 = 0;
    iVar13 = 0;
    do {
      iVar10 = piVar3[lVar7];
      if (((long)iVar10 < 1) || (p->nObjsAlloc <= iVar10)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar2 = p->pObjs + iVar10;
      if ((char)*(ushort *)pWVar2 < '\0' && (*(ushort *)pWVar2 & 0x3f) != 1) {
        uVar12 = 0;
        do {
          __dest[uVar12 + (long)iVar9] = __dest[uVar12 + (long)iVar13];
          uVar1 = uVar12 + 1;
          uVar8 = pWVar2->End - pWVar2->Beg;
          uVar4 = -uVar8;
          if (0 < (int)uVar8) {
            uVar4 = uVar8;
          }
          bVar14 = uVar12 < uVar4;
          uVar12 = uVar1;
        } while (bVar14);
        iVar9 = iVar9 + (int)uVar1;
      }
      if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        iVar11 = pWVar2->End - pWVar2->Beg;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        iVar13 = iVar13 + iVar10 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6);
    lVar6 = (long)iVar9;
  }
  __dest[lVar6] = '\0';
  sVar5 = strlen(pInit);
  if (iVar13 == (int)sVar5) {
    return __dest;
  }
  __assert_fail("nBits == (int)strlen(pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                ,0x379,"char *Wlc_ReduceMarkedInitStr(Wlc_Ntk_t *, char *)");
}

Assistant:

char * Wlc_ReduceMarkedInitStr( Wlc_Ntk_t * p, char * pInit )
{
    char * pInitNew = Abc_UtilStrsav( pInit );
    Wlc_Obj_t * pObj; int i, b, nBits = 0, k = 0;
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            for ( b = 0; b < Wlc_ObjRange(pObj); b++ )
                pInitNew[k++] = pInitNew[nBits+b];
        if ( !Wlc_ObjIsPi(pObj) )
            nBits += Wlc_ObjRange(pObj);
    }
    pInitNew[k] = '\0';
    assert( nBits == (int)strlen(pInit) );
    return pInitNew;
}